

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_arm_shift_im(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,int shiftop,int shift,int flags)

{
  TCGTemp *a3;
  int32_t arg2;
  uintptr_t o;
  int iVar1;
  uintptr_t o_1;
  
  switch(shiftop) {
  case 0:
    if (shift != 0) {
      if (flags != 0) {
        tcg_gen_extract_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,0x20 - shift,1);
      }
      tcg_gen_shli_i32_aarch64(tcg_ctx,var,var,shift);
      return;
    }
    break;
  case 1:
    if (shift == 0) {
      if (flags != 0) {
        tcg_gen_shri_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,0x1f);
      }
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(var + (long)tcg_ctx),0);
      return;
    }
    if (flags != 0) {
      tcg_gen_extract_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,shift - 1,1);
    }
    tcg_gen_shri_i32_aarch64(tcg_ctx,var,var,shift);
    return;
  case 2:
    iVar1 = 0x20;
    if (shift != 0) {
      iVar1 = shift;
    }
    if (flags != 0) {
      tcg_gen_extract_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,iVar1 - 1,1);
    }
    arg2 = 0x1f;
    if (iVar1 != 0x20) {
      arg2 = iVar1;
    }
    tcg_gen_sari_i32_aarch64(tcg_ctx,var,var,arg2);
    return;
  case 3:
    if (shift == 0) {
      a3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      tcg_gen_shli_i32_aarch64(tcg_ctx,(TCGv_i32)((long)a3 - (long)tcg_ctx),tcg_ctx->cpu_CF,0x1f);
      if (flags != 0) {
        tcg_gen_extract_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,0,1);
      }
      tcg_gen_shri_i32_aarch64(tcg_ctx,var,var,1);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i32,(TCGArg)(var + (long)tcg_ctx),
                          (TCGArg)(var + (long)tcg_ctx),(TCGArg)a3);
      tcg_temp_free_internal_aarch64
                (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)a3 - (long)tcg_ctx) + (long)tcg_ctx));
      return;
    }
    if (flags != 0) {
      tcg_gen_extract_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,var,shift - 1,1);
    }
    tcg_gen_rotri_i32_aarch64(tcg_ctx,var,var,shift);
    return;
  }
  return;
}

Assistant:

static inline void gen_arm_shift_im(TCGContext *tcg_ctx, TCGv_i32 var, int shiftop,
                                    int shift, int flags)
{
    switch (shiftop) {
    case 0: /* LSL */
        if (shift != 0) {
            if (flags)
                shifter_out_im(tcg_ctx, var, 32 - shift);
            tcg_gen_shli_i32(tcg_ctx, var, var, shift);
        }
        break;
    case 1: /* LSR */
        if (shift == 0) {
            if (flags) {
                tcg_gen_shri_i32(tcg_ctx, tcg_ctx->cpu_CF, var, 31);
            }
            tcg_gen_movi_i32(tcg_ctx, var, 0);
        } else {
            if (flags)
                shifter_out_im(tcg_ctx, var, shift - 1);
            tcg_gen_shri_i32(tcg_ctx, var, var, shift);
        }
        break;
    case 2: /* ASR */
        if (shift == 0)
            shift = 32;
        if (flags)
            shifter_out_im(tcg_ctx, var, shift - 1);
        if (shift == 32)
          shift = 31;
        tcg_gen_sari_i32(tcg_ctx, var, var, shift);
        break;
    case 3: /* ROR/RRX */
        if (shift != 0) {
            if (flags)
                shifter_out_im(tcg_ctx, var, shift - 1);
            tcg_gen_rotri_i32(tcg_ctx, var, var, shift); break;
        } else {
            TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shli_i32(tcg_ctx, tmp, tcg_ctx->cpu_CF, 31);
            if (flags)
                shifter_out_im(tcg_ctx, var, 0);
            tcg_gen_shri_i32(tcg_ctx, var, var, 1);
            tcg_gen_or_i32(tcg_ctx, var, var, tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
        }
    }
}